

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

uint8_t * cfd::core::AllocWallyBuffer(uint8_t *source,size_t length)

{
  CfdException *pCVar1;
  allocator local_109;
  string local_108;
  CfdSourceLocation local_e8;
  uint8_t *local_d0;
  void *addr;
  allocator local_b1;
  string local_b0;
  CfdSourceLocation local_90;
  undefined8 local_78;
  wally_operations ops;
  int ret;
  wally_malloc_t malloc_func;
  size_t length_local;
  uint8_t *source_local;
  
  memset(&local_78,0,0x50);
  local_78 = 0x50;
  ops.reserved_4._4_4_ = wally_get_operations(&local_78);
  if (ops.reserved_4._4_4_ != 0) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x197;
    local_90.funcname = "AllocWallyBuffer";
    logger::warn<int&>(&local_90,"wally_get_operations NG[{}]",(int *)((long)&ops.reserved_4 + 4));
    addr._3_1_ = 1;
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_b0,"OperationFunctions get error.",&local_b1);
    CfdException::CfdException(pCVar1,kCfdInternalError,&local_b0);
    addr._3_1_ = 0;
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_d0 = (uint8_t *)(*(code *)ops.struct_size)(length);
  if (local_d0 != (uint8_t *)0x0) {
    memcpy(local_d0,source,length);
    return local_d0;
  }
  local_e8.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
               ,0x2f);
  local_e8.filename = local_e8.filename + 1;
  local_e8.line = 0x19e;
  local_e8.funcname = "AllocWallyBuffer";
  logger::warn<>(&local_e8,"wally malloc NG.");
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_108,"malloc error.",&local_109);
  CfdException::CfdException(pCVar1,kCfdMemoryFullError,&local_108);
  __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

uint8_t *AllocWallyBuffer(const uint8_t *source, size_t length) {
  wally_malloc_t malloc_func = nullptr;

  int ret;
  if (malloc_func == nullptr) {
    struct wally_operations ops;
    memset(&ops, 0, sizeof(ops));
    ops.struct_size = sizeof(ops);
    ret = wally_get_operations(&ops);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_get_operations NG[{}]", ret);
      throw CfdException(kCfdInternalError, "OperationFunctions get error.");
    }
    malloc_func = ops.malloc_fn;
  }
  void *addr = malloc_func(length);
  if (addr == nullptr) {
    warn(CFD_LOG_SOURCE, "wally malloc NG.");
    throw CfdException(kCfdMemoryFullError, "malloc error.");
  }
  memcpy(addr, source, length);
  return static_cast<uint8_t *>(addr);
}